

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int cvLsBandDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1,
                 N_Vector tmp2)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  sunrealtype *psVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  sunindextype sVar17;
  long j;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_d8;
  long local_b8;
  double local_b0;
  long local_a0;
  long local_98;
  
  pvVar2 = cv_mem->cv_lmem;
  sVar4 = SUNBandMatrix_Columns(Jac);
  sVar5 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar6 = SUNBandMatrix_LowerBandwidth(Jac);
  lVar7 = N_VGetArrayPointer(cv_mem->cv_ewt);
  lVar8 = N_VGetArrayPointer(fy);
  lVar9 = N_VGetArrayPointer(tmp1);
  lVar10 = N_VGetArrayPointer(y);
  lVar11 = N_VGetArrayPointer(tmp2);
  if (cv_mem->cv_constraintsSet == 0) {
    local_b8 = 0;
  }
  else {
    local_b8 = N_VGetArrayPointer(cv_mem->cv_constraints);
  }
  local_b0 = 1.0;
  N_VScale(y,tmp2);
  dVar22 = cv_mem->cv_uround;
  local_d8 = 0.0;
  if (0.0 < dVar22) {
    if (dVar22 < 0.0) {
      local_d8 = sqrt(dVar22);
    }
    else {
      local_d8 = SQRT(dVar22);
    }
  }
  dVar22 = (double)N_VWrmsNorm(fy,cv_mem->cv_ewt);
  if ((dVar22 != 0.0) || (NAN(dVar22))) {
    local_b0 = dVar22 * (double)sVar4 * ABS(cv_mem->cv_h) * 1000.0 * cv_mem->cv_uround;
  }
  lVar15 = sVar5 + sVar6 + 1;
  sVar17 = sVar4;
  if (lVar15 < sVar4) {
    sVar17 = lVar15;
  }
  if (0 < sVar17) {
    local_98 = -sVar5;
    local_a0 = 0;
    lVar18 = 1;
    do {
      j = lVar18 + -1;
      iVar3 = cv_mem->cv_constraintsSet;
      lVar13 = j;
      do {
        dVar22 = ABS(*(double *)(lVar10 + lVar13 * 8)) * local_d8;
        dVar23 = local_b0 / *(double *)(lVar7 + lVar13 * 8);
        if (dVar22 <= dVar23) {
          dVar22 = dVar23;
        }
        if (iVar3 != 0) {
          dVar23 = *(double *)(local_b8 + lVar13 * 8);
          dVar24 = ABS(dVar23);
          if ((dVar24 != 1.0) || (NAN(dVar24))) {
            if ((dVar24 == 2.0) &&
               ((!NAN(dVar24) && (dVar23 * (*(double *)(lVar11 + lVar13 * 8) + dVar22) <= 0.0))))
            goto LAB_00129255;
          }
          else if (dVar23 * (*(double *)(lVar11 + lVar13 * 8) + dVar22) < 0.0) {
LAB_00129255:
            dVar22 = -dVar22;
          }
        }
        *(double *)(lVar11 + lVar13 * 8) = dVar22 + *(double *)(lVar11 + lVar13 * 8);
        lVar13 = lVar13 + lVar15;
      } while (lVar13 < sVar4);
      iVar3 = (*cv_mem->cv_f)(t,tmp2,tmp1,cv_mem->cv_user_data);
      plVar1 = (long *)((long)pvVar2 + 0x90);
      *plVar1 = *plVar1 + 1;
      lVar13 = local_98;
      lVar19 = local_a0;
      if (iVar3 != 0) {
        return iVar3;
      }
      do {
        lVar20 = 0;
        if (0 < lVar13) {
          lVar20 = lVar13;
        }
        *(undefined8 *)(lVar11 + j * 8) = *(undefined8 *)(lVar10 + j * 8);
        psVar12 = SUNBandMatrix_Column(Jac,j);
        dVar23 = local_b0 / *(double *)(lVar7 + j * 8);
        dVar22 = ABS(*(double *)(lVar10 + j * 8)) * local_d8;
        if (dVar22 <= dVar23) {
          dVar22 = dVar23;
        }
        if (cv_mem->cv_constraintsSet != 0) {
          dVar23 = *(double *)(local_b8 + j * 8);
          dVar24 = ABS(dVar23);
          if ((dVar24 != 1.0) || (NAN(dVar24))) {
            if ((dVar24 == 2.0) &&
               ((!NAN(dVar24) && (dVar23 * (*(double *)(lVar11 + j * 8) + dVar22) <= 0.0))))
            goto LAB_001293aa;
          }
          else if (dVar23 * (*(double *)(lVar11 + j * 8) + dVar22) < 0.0) {
LAB_001293aa:
            dVar22 = -dVar22;
          }
        }
        lVar16 = j - sVar5;
        if (lVar16 < 1) {
          lVar16 = 0;
        }
        lVar14 = sVar6 + j;
        if (sVar4 + -1 <= sVar6 + j) {
          lVar14 = sVar4 + -1;
        }
        if (lVar16 <= lVar14) {
          lVar20 = lVar20 + -1;
          do {
            *(double *)((long)psVar12 + lVar20 * 8 + lVar19 + 8) =
                 (*(double *)(lVar9 + 8 + lVar20 * 8) - *(double *)(lVar8 + 8 + lVar20 * 8)) *
                 (1.0 / dVar22);
            lVar20 = lVar20 + 1;
          } while (lVar20 < lVar14);
        }
        j = j + lVar15;
        lVar13 = lVar13 + lVar15;
        lVar19 = lVar19 + ~(sVar5 + sVar6) * 8;
      } while (j < sVar4);
      local_98 = local_98 + 1;
      local_a0 = local_a0 + -8;
      bVar21 = lVar18 != sVar17;
      lVar18 = lVar18 + 1;
    } while (bVar21);
  }
  return 0;
}

Assistant:

int cvLsBandDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                  CVodeMem cv_mem, N_Vector tmp1, N_Vector tmp2)
{
  N_Vector ftemp, ytemp;
  sunrealtype fnorm, minInc, inc, inc_inv, srur, conj;
  sunrealtype *col_j, *ewt_data, *fy_data, *ftemp_data;
  sunrealtype *y_data, *ytemp_data, *cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(cv_mem->cv_ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  if (cv_mem->cv_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);
  }

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(cv_mem->cv_uround);
  fnorm  = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ? (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) *
                              cv_mem->cv_uround * N * fnorm)
                           : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all y_j in group */
    for (j = group - 1; j < N; j += width)
    {
      inc = SUNMAX(srur * SUNRabs(y_data[j]), minInc / ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (cv_mem->cv_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((ytemp_data[j] + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((ytemp_data[j] + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = cv_mem->cv_f(t, ytemp, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) { break; }

    /* Restore ytemp, then form and load difference quotients */
    for (j = group - 1; j < N; j += width)
    {
      ytemp_data[j] = y_data[j];
      col_j         = SUNBandMatrix_Column(Jac, j);
      inc           = SUNMAX(srur * SUNRabs(y_data[j]), minInc / ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (cv_mem->cv_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((ytemp_data[j] + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((ytemp_data[j] + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv * (ftemp_data[i] - fy_data[i]);
      }
    }
  }

  return (retval);
}